

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_err_t * mpca_lang_st(mpc_input_t *i,mpca_grammar_st_t *st)

{
  int iVar1;
  mpc_parser_t *p;
  mpc_parser_t *p_00;
  mpc_parser_t *p_01;
  mpc_parser_t *p_02;
  mpc_parser_t *p_03;
  mpc_parser_t *p_04;
  mpc_parser_t *pmVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  void *pvVar5;
  mpc_parser_t *pmVar6;
  mpc_parser_t *pmVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  mpc_result_t r;
  
  p = mpc_new("lang");
  p_00 = mpc_new("stmt");
  p_01 = mpc_new("grammar");
  p_02 = mpc_new("term");
  p_03 = mpc_new("factor");
  p_04 = mpc_new("base");
  pmVar2 = (mpc_parser_t *)calloc(1,0x38);
  pmVar2->type = '\x14';
  (pmVar2->data).repeat.x = p_00;
  (pmVar2->data).apply.f = mpca_stmt_fold;
  pmVar3 = (mpc_parser_t *)calloc(1,0x38);
  pmVar3->type = '\x11';
  (pmVar3->data).expect.x = pmVar2;
  pmVar2 = mpc_strip(pmVar3);
  pmVar2 = mpc_whole(pmVar2,mpca_stmt_list_delete);
  pmVar3 = (mpc_parser_t *)calloc(1,0x38);
  pmVar3->type = '\x10';
  (pmVar3->data).expect.x = pmVar2;
  (pmVar3->data).apply.f = mpca_stmt_list_apply_to;
  (pmVar3->data).repeat.x = (mpc_parser_t *)st;
  mpc_define(p,pmVar3);
  pmVar2 = mpc_ident();
  pmVar3 = mpc_blank();
  pmVar2 = mpc_and(2,mpcf_fst,pmVar2,pmVar3,mpcf_dtor_null);
  pmVar3 = mpc_string_lit();
  pmVar4 = mpc_blank();
  pmVar3 = mpc_and(2,mpcf_fst,pmVar3,pmVar4,mpcf_dtor_null);
  pvVar5 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar5 + 0x30) = 0x13;
  *(mpc_parser_t **)((long)pvVar5 + 8) = pmVar3;
  *(code **)((long)pvVar5 + 0x18) = mpcf_ctor_null;
  pmVar3 = mpc_sym(":");
  pmVar4 = mpc_sym(";");
  pmVar2 = mpc_and(5,mpca_stmt_afold,pmVar2,pvVar5,pmVar3,p_01,pmVar4,free,free,free,mpc_soft_delete
                  );
  mpc_define(p_00,pmVar2);
  pmVar2 = mpc_sym("|");
  pmVar2 = mpc_and(2,mpcf_snd_free,pmVar2,p_01,free);
  pvVar5 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar5 + 0x30) = 0x13;
  *(mpc_parser_t **)((long)pvVar5 + 8) = pmVar2;
  *(code **)((long)pvVar5 + 0x18) = mpcf_ctor_null;
  pmVar2 = mpc_and(2,mpcaf_grammar_or,p_02,pvVar5,mpc_soft_delete);
  mpc_define(p_01,pmVar2);
  pmVar2 = (mpc_parser_t *)calloc(1,0x38);
  pmVar2->type = '\x15';
  (pmVar2->data).repeat.x = p_03;
  (pmVar2->data).apply.f = mpcaf_grammar_and;
  mpc_define(p_02,pmVar2);
  pmVar2 = mpc_sym("*");
  pmVar3 = mpc_sym("+");
  pmVar4 = mpc_sym("?");
  pmVar6 = mpc_sym("!");
  pmVar7 = mpc_int();
  pmVar7 = mpc_tok_between(pmVar7,free,"{","}");
  pvVar5 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar5 + 0x30) = 1;
  pmVar2 = mpc_or(6,pmVar2,pmVar3,pmVar4,pmVar6,pmVar7,pvVar5);
  pmVar2 = mpc_and(2,mpcaf_grammar_repeat,p_04,pmVar2,mpc_soft_delete);
  mpc_define(p_03,pmVar2);
  pmVar2 = mpc_string_lit();
  pmVar3 = mpc_blank();
  pmVar2 = mpc_and(2,mpcf_fst,pmVar2,pmVar3,mpcf_dtor_null);
  pvVar5 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar5 + 0x30) = 0x10;
  *(mpc_parser_t **)((long)pvVar5 + 8) = pmVar2;
  *(code **)((long)pvVar5 + 0x10) = mpcaf_grammar_string;
  *(mpca_grammar_st_t **)((long)pvVar5 + 0x18) = st;
  pmVar2 = mpc_char_lit();
  pmVar3 = mpc_blank();
  pmVar2 = mpc_and(2,mpcf_fst,pmVar2,pmVar3,mpcf_dtor_null);
  pvVar8 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar8 + 0x30) = 0x10;
  *(mpc_parser_t **)((long)pvVar8 + 8) = pmVar2;
  *(code **)((long)pvVar8 + 0x10) = mpcaf_grammar_char;
  *(mpca_grammar_st_t **)((long)pvVar8 + 0x18) = st;
  pmVar2 = mpc_regex_lit();
  pmVar3 = mpc_oneof("ms");
  pvVar9 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar9 + 0x30) = 0x14;
  *(mpc_parser_t **)((long)pvVar9 + 0x18) = pmVar3;
  *(code **)((long)pvVar9 + 0x10) = mpcf_strfold;
  pvVar10 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar10 + 0x30) = 4;
  *(mpca_grammar_st_t **)((long)pvVar10 + 0x10) = st;
  pmVar2 = mpc_and(3,mpcaf_fold_regex,pmVar2,pvVar9,pvVar10,free,free);
  pmVar3 = mpc_blank();
  pmVar2 = mpc_and(2,mpcf_fst,pmVar2,pmVar3,mpcf_dtor_null);
  pmVar3 = mpc_digits();
  pmVar4 = mpc_ident();
  pmVar3 = mpc_or(2,pmVar3,pmVar4);
  pmVar3 = mpc_tok_between(pmVar3,free,"<",">");
  pvVar9 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar9 + 0x30) = 0x10;
  *(mpc_parser_t **)((long)pvVar9 + 8) = pmVar3;
  *(code **)((long)pvVar9 + 0x10) = mpcaf_grammar_id;
  *(mpca_grammar_st_t **)((long)pvVar9 + 0x18) = st;
  pmVar3 = mpc_tok_between(p_01,mpc_soft_delete,"(",")");
  pmVar2 = mpc_or(5,pvVar5,pvVar8,pmVar2,pvVar9,pmVar3);
  mpc_define(p_04,pmVar2);
  mpc_optimise_unretained(p,1);
  mpc_optimise_unretained(p_00,1);
  mpc_optimise_unretained(p_01,1);
  mpc_optimise_unretained(p_02,1);
  mpc_optimise_unretained(p_03,1);
  mpc_optimise_unretained(p_04,1);
  iVar1 = mpc_parse_input(i,p,&r);
  if (iVar1 != 0) {
    r.error = (mpc_err_t *)0x0;
  }
  mpc_cleanup(6,p,p_00,p_01,p_02,p_03,p_04);
  return r.error;
}

Assistant:

static mpc_err_t *mpca_lang_st(mpc_input_t *i, mpca_grammar_st_t *st) {

  mpc_result_t r;
  mpc_err_t *e;
  mpc_parser_t *Lang, *Stmt, *Grammar, *Term, *Factor, *Base;

  Lang    = mpc_new("lang");
  Stmt    = mpc_new("stmt");
  Grammar = mpc_new("grammar");
  Term    = mpc_new("term");
  Factor  = mpc_new("factor");
  Base    = mpc_new("base");

  mpc_define(Lang, mpc_apply_to(
    mpc_total(mpc_predictive(mpc_many(mpca_stmt_fold, Stmt)), mpca_stmt_list_delete),
    mpca_stmt_list_apply_to, st
  ));

  mpc_define(Stmt, mpc_and(5, mpca_stmt_afold,
    mpc_tok(mpc_ident()), mpc_maybe(mpc_tok(mpc_string_lit())), mpc_sym(":"), Grammar, mpc_sym(";"),
    free, free, free, mpc_soft_delete
  ));

  mpc_define(Grammar, mpc_and(2, mpcaf_grammar_or,
      Term,
      mpc_maybe(mpc_and(2, mpcf_snd_free, mpc_sym("|"), Grammar, free)),
      mpc_soft_delete
  ));

  mpc_define(Term, mpc_many1(mpcaf_grammar_and, Factor));

  mpc_define(Factor, mpc_and(2, mpcaf_grammar_repeat,
    Base,
      mpc_or(6,
        mpc_sym("*"),
        mpc_sym("+"),
        mpc_sym("?"),
        mpc_sym("!"),
        mpc_tok_brackets(mpc_int(), free),
        mpc_pass()),
    mpc_soft_delete
  ));

  mpc_define(Base, mpc_or(5,
    mpc_apply_to(mpc_tok(mpc_string_lit()), mpcaf_grammar_string, st),
    mpc_apply_to(mpc_tok(mpc_char_lit()),   mpcaf_grammar_char, st),
    mpc_tok(mpc_and(3, mpcaf_fold_regex, mpc_regex_lit(), mpc_many(mpcf_strfold, mpc_oneof("ms")), mpc_lift_val(st), free, free)),
    mpc_apply_to(mpc_tok_braces(mpc_or(2, mpc_digits(), mpc_ident()), free), mpcaf_grammar_id, st),
    mpc_tok_parens(Grammar, mpc_soft_delete)
  ));

  mpc_optimise(Lang);
  mpc_optimise(Stmt);
  mpc_optimise(Grammar);
  mpc_optimise(Term);
  mpc_optimise(Factor);
  mpc_optimise(Base);

  if (!mpc_parse_input(i, Lang, &r)) {
    e = r.error;
  } else {
    e = NULL;
  }

  mpc_cleanup(6, Lang, Stmt, Grammar, Term, Factor, Base);

  return e;
}